

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O2

void __thiscall CodeGen::CodeGen(CodeGen *this)

{
  ostringstream *this_00;
  ostringstream aoStack_188 [376];
  
  *(undefined ***)this = &PTR_visit_0010ece0;
  this_00 = &this->builder;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  std::__cxx11::ostringstream::operator=((ostringstream *)this_00,aoStack_188);
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  this->indentLevel = 1;
  std::operator<<((ostream *)this_00,
                  "// Generated by bfc\n#include <stdio.h>\n#include <stdlib.h>\n#include <string.h>\n\nint main() {\n"
                 );
  std::operator<<((ostream *)this_00,
                  "  unsigned char* memory = (unsigned char*) malloc(80000);\n  memset(memory, 0, 80000);\n  long long current = 40000;\n"
                 );
  return;
}

Assistant:

explicit inline CodeGen() {
        builder = {};
        indentLevel = 1;

        builder << "// Generated by bfc\n#include <stdio.h>\n#include <stdlib.h>\n#include <string.h>\n\nint main() {\n";
        builder << "  unsigned char* memory = (unsigned char*) malloc(80000);\n  memset(memory, 0, 80000);\n  long long current = 40000;\n";
    }